

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_wait.c
# Opt level: O0

int ASYNC_WAIT_CTX_set_wait_fd
              (ASYNC_WAIT_CTX *ctx,void *key,int fd,void *custom_data,
              _func_void_ASYNC_WAIT_CTX_ptr_void_ptr_int_void_ptr *cleanup)

{
  undefined8 *puVar1;
  char *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  fd_lookup_st *fdlookup;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_4;
  
  puVar1 = (undefined8 *)
           CRYPTO_zalloc(CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX,
                         (int)((ulong)in_R8 >> 0x20));
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = in_RSI;
    *(undefined4 *)(puVar1 + 1) = in_EDX;
    puVar1[2] = in_RCX;
    puVar1[3] = in_R8;
    *(undefined4 *)(puVar1 + 4) = 1;
    puVar1[5] = *in_RDI;
    *in_RDI = puVar1;
    in_RDI[1] = in_RDI[1] + 1;
  }
  else {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),(int)((ulong)in_RCX >> 0x20),
                  in_R8);
    ERR_set_error(0x33,0xc0100,(char *)0x0);
  }
  local_4 = (uint)(puVar1 != (undefined8 *)0x0);
  return local_4;
}

Assistant:

int ASYNC_WAIT_CTX_set_wait_fd(ASYNC_WAIT_CTX *ctx, const void *key,
                               OSSL_ASYNC_FD fd, void *custom_data,
                               void (*cleanup)(ASYNC_WAIT_CTX *, const void *,
                                               OSSL_ASYNC_FD, void *))
{
    struct fd_lookup_st *fdlookup;

    if ((fdlookup = OPENSSL_zalloc(sizeof(*fdlookup))) == NULL) {
        ERR_raise(ERR_LIB_ASYNC, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    fdlookup->key = key;
    fdlookup->fd = fd;
    fdlookup->custom_data = custom_data;
    fdlookup->cleanup = cleanup;
    fdlookup->add = 1;
    fdlookup->next = ctx->fds;
    ctx->fds = fdlookup;
    ctx->numadd++;
    return 1;
}